

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_image_writer.cpp
# Opt level: O2

ssize_t __thiscall PgmImageWriter::write(PgmImageWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  uint8_t *puVar5;
  undefined4 in_register_00000034;
  Stream *this_00;
  int y;
  int iVar6;
  string local_50;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  uVar1 = dpfb::Image::getWidth((Image *)__buf);
  uVar2 = dpfb::Image::getHeight((Image *)__buf);
  iVar6 = 0;
  dpfb::str::format_abi_cxx11_(&local_50,"P5\n%i %i\n255\n",(ulong)uVar1,(ulong)uVar2);
  dpfb::streams::Stream::writeStr(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  while( true ) {
    iVar3 = dpfb::Image::getHeight((Image *)__buf);
    if (iVar3 <= iVar6) break;
    puVar5 = dpfb::Image::getData((Image *)__buf);
    iVar3 = dpfb::Image::getPitch((Image *)__buf);
    iVar4 = dpfb::Image::getWidth((Image *)__buf);
    (*this_00->_vptr_Stream[3])(this_00,puVar5 + iVar3 * iVar6,(long)iVar4);
    iVar6 = iVar6 + 1;
  }
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

void PgmImageWriter::write(
    dpfb::streams::Stream& stream, const dpfb::Image& image) const
{
    stream.writeStr(
        dpfb::str::format(
            "P5\n%i %i\n255\n",
            image.getWidth(), image.getHeight()));
    for (int y = 0; y < image.getHeight(); ++y)
        stream.writeBuffer(
            image.getData() + y * image.getPitch(), image.getWidth());
}